

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  size_t sVar1;
  size_t sVar2;
  SimpleString local_40;
  SimpleString local_30;
  char local_1b [3];
  char pad [2];
  SimpleString *pSStack_18;
  char padCharacter_local;
  SimpleString *str2_local;
  SimpleString *str1_local;
  
  local_1b[2] = padCharacter;
  pSStack_18 = str2;
  sVar1 = size(str1);
  sVar2 = size(pSStack_18);
  if (sVar2 < sVar1) {
    padStringsToSameLength(pSStack_18,str1,local_1b[2]);
  }
  else {
    local_1b[0] = local_1b[2];
    local_1b[1] = 0;
    sVar1 = size(pSStack_18);
    sVar2 = size(str1);
    SimpleString(&local_40,local_1b,sVar1 - sVar2);
    operator+(&local_30,&local_40);
    operator=(str1,&local_30);
    ~SimpleString(&local_30);
    ~SimpleString(&local_40);
  }
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}